

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::ascii_strcasecmp(char *a,char *b,int len)

{
  byte local_32;
  uint8 y;
  uint8 x;
  char *ae;
  byte *pbStack_20;
  int len_local;
  char *b_local;
  char *a_local;
  
  pbStack_20 = (byte *)b;
  b_local = a;
  while( true ) {
    if (a + len <= b_local) {
      return 0;
    }
    local_32 = *pbStack_20;
    if ((0x40 < local_32) && (local_32 < 0x5b)) {
      local_32 = local_32 + 0x20;
    }
    if (*b_local != local_32) break;
    b_local = b_local + 1;
    pbStack_20 = pbStack_20 + 1;
  }
  return (uint)(byte)*b_local - (uint)local_32;
}

Assistant:

static int ascii_strcasecmp(const char* a, const char* b, int len) {
  const char *ae = a + len;

  for (; a < ae; a++, b++) {
    uint8 x = *a;
    uint8 y = *b;
    if ('A' <= y && y <= 'Z')
      y += 'a' - 'A';
    if (x != y)
      return x - y;
  }
  return 0;
}